

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfuturewatcher.cpp
# Opt level: O0

void __thiscall
QFutureWatcherBase::disconnectOutputInterface(QFutureWatcherBase *this,bool pendingAssignment)

{
  byte bVar1;
  byte in_SIL;
  QFutureCallOutInterface *in_RDI;
  QFutureWatcherBasePrivate *d;
  undefined8 in_stack_ffffffffffffffc8;
  int newValue;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffffd0;
  undefined7 in_stack_fffffffffffffff0;
  QFutureCallOutInterface *iface;
  
  newValue = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  bVar1 = in_SIL & 1;
  iface = in_RDI;
  if (bVar1 != 0) {
    d_func((QFutureWatcherBase *)0x6e7251);
    QBasicAtomicInteger<int>::storeRelaxed(in_stack_ffffffffffffffd0,newValue);
  }
  (*in_RDI->_vptr_QFutureCallOutInterface[0xd])();
  d_func((QFutureWatcherBase *)0x6e7286);
  QFutureInterfaceBasePrivate::disconnectOutputInterface
            ((QFutureInterfaceBasePrivate *)CONCAT17(bVar1,in_stack_fffffffffffffff0),iface);
  return;
}

Assistant:

void QFutureWatcherBase::disconnectOutputInterface(bool pendingAssignment)
{
    if (pendingAssignment) {
        Q_D(QFutureWatcherBase);
        d->pendingResultsReady.storeRelaxed(0);
    }

    futureInterface().d->disconnectOutputInterface(d_func());
}